

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void wallet::UpdateWalletSetting
               (Chain *chain,string *wallet_name,optional<bool> load_on_startup,
               vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  bool bVar1;
  string *this;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff68;
  string local_70 [32];
  bilingual_str local_50;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ushort)load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    if (((ushort)load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> & 1) == 0) {
      bVar1 = RemoveWalletSetting(chain,wallet_name);
      if (bVar1) goto LAB_001405b5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff70,
                 "Wallet load on startup setting could not be updated, so wallet may still be loaded next node startup."
                 ,(allocator<char> *)&stack0xffffffffffffff6f);
      Untranslated(&local_50,in_stack_ffffffffffffff68);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                (warnings,&local_50);
      bilingual_str::~bilingual_str(&local_50);
      this = (string *)&stack0xffffffffffffff70;
    }
    else {
      bVar1 = AddWalletSetting(chain,wallet_name);
      if (bVar1) goto LAB_001405b5;
      std::__cxx11::string::string<std::allocator<char>>
                (local_70,
                 "Wallet load on startup setting could not be updated, so wallet may not be loaded next node startup."
                 ,(allocator<char> *)&stack0xffffffffffffff6f);
      Untranslated(&local_50,in_stack_ffffffffffffff68);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                (warnings,&local_50);
      bilingual_str::~bilingual_str(&local_50);
      this = local_70;
    }
    std::__cxx11::string::~string(this);
  }
LAB_001405b5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void UpdateWalletSetting(interfaces::Chain& chain,
                                const std::string& wallet_name,
                                std::optional<bool> load_on_startup,
                                std::vector<bilingual_str>& warnings)
{
    if (!load_on_startup) return;
    if (load_on_startup.value() && !AddWalletSetting(chain, wallet_name)) {
        warnings.emplace_back(Untranslated("Wallet load on startup setting could not be updated, so wallet may not be loaded next node startup."));
    } else if (!load_on_startup.value() && !RemoveWalletSetting(chain, wallet_name)) {
        warnings.emplace_back(Untranslated("Wallet load on startup setting could not be updated, so wallet may still be loaded next node startup."));
    }
}